

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O0

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::AddMessage
          (ExtensionSet *this,FieldDescriptor *descriptor,MessageFactory *factory)

{
  Extension *pEVar1;
  bool bVar2;
  Descriptor *pDVar3;
  LogMessage *pLVar4;
  LogMessage local_50;
  Voidify local_39;
  MessageLite *local_38;
  MessageLite *prototype;
  MessageLite *result;
  Extension *extension;
  MessageFactory *factory_local;
  FieldDescriptor *descriptor_local;
  ExtensionSet *this_local;
  
  extension = (Extension *)factory;
  factory_local = (MessageFactory *)descriptor;
  descriptor_local = (FieldDescriptor *)this;
  result = (MessageLite *)MaybeNewRepeatedExtension(this,descriptor);
  prototype = RepeatedPtrFieldBase::
              AddFromCleared<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                        ((RepeatedPtrFieldBase *)((Extension *)result)->field_0);
  if (prototype ==
      (Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>_> *)0x0)
  {
    bVar2 = RepeatedPtrField<google::protobuf::MessageLite>::empty
                      ((RepeatedPtrField<google::protobuf::MessageLite> *)result->_vptr_MessageLite)
    ;
    pEVar1 = extension;
    if (bVar2) {
      pDVar3 = FieldDescriptor::message_type((FieldDescriptor *)factory_local);
      local_38 = (MessageLite *)(**(code **)((pEVar1->field_0).int64_t_value + 0x10))(pEVar1,pDVar3)
      ;
      if (local_38 == (MessageLite *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_50,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_heavy.cc"
                   ,0xf1,"prototype != nullptr");
        pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar4);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_50);
      }
    }
    else {
      local_38 = RepeatedPtrField<google::protobuf::MessageLite>::Get
                           ((RepeatedPtrField<google::protobuf::MessageLite> *)
                            result->_vptr_MessageLite,0);
    }
    prototype = MessageLite::New(local_38,this->arena_);
    RepeatedPtrField<google::protobuf::MessageLite>::AddAllocated
              ((RepeatedPtrField<google::protobuf::MessageLite> *)result->_vptr_MessageLite,
               prototype);
  }
  return prototype;
}

Assistant:

MessageLite* ExtensionSet::AddMessage(const FieldDescriptor* descriptor,
                                      MessageFactory* factory) {
  Extension* extension = MaybeNewRepeatedExtension(descriptor);

  // RepeatedPtrField<Message> does not know how to Add() since it cannot
  // allocate an abstract object, so we have to be tricky.
  MessageLite* result =
      reinterpret_cast<internal::RepeatedPtrFieldBase*>(
          extension->ptr.repeated_message_value)
          ->AddFromCleared<GenericTypeHandler<MessageLite> >();
  if (result == nullptr) {
    const MessageLite* prototype;
    if (extension->ptr.repeated_message_value->empty()) {
      prototype = factory->GetPrototype(descriptor->message_type());
      ABSL_CHECK(prototype != nullptr);
    } else {
      prototype = &extension->ptr.repeated_message_value->Get(0);
    }
    result = prototype->New(arena_);
    extension->ptr.repeated_message_value->AddAllocated(result);
  }
  return result;
}